

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O1

int MPIABI_Win_shared_query(MPIABI_Win win,int rank,MPIABI_Aint *size,int *disp_unit,void *baseptr)

{
  int iVar1;
  
  iVar1 = MPI_Win_shared_query();
  return iVar1;
}

Assistant:

int MPIABI_Win_shared_query(
  MPIABI_Win win,
  int rank,
  MPIABI_Aint * size,
  int * disp_unit,
  void * baseptr
) {
  return MPI_Win_shared_query(
    (MPI_Win)(WPI_Win)win,
    rank,
    (MPI_Aint *)(WPI_Aint *)size,
    disp_unit,
    baseptr
  );
}